

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O0

int history_save_fp(History *h,size_t nelem,FILE_conflict *fp)

{
  undefined8 mbsrc;
  FILE_conflict *pFVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  char *nptr;
  char *str;
  char *ptr;
  size_t max_size;
  size_t len;
  int retval;
  int i;
  HistEvent_conflict ev;
  FILE_conflict *fp_local;
  size_t nelem_local;
  History *h_local;
  
  len._4_4_ = -1;
  ev.str = (char *)fp;
  lVar3 = ftell((FILE *)fp);
  if ((lVar3 != 0) || (iVar2 = fputs("_HiStOrY_V2_\n",(FILE *)ev.str), iVar2 != -1)) {
    ptr = (char *)0x400;
    str = (char *)malloc(0x400);
    if (str != (char *)0x0) {
      if (nelem == 0xffffffffffffffff) {
        len._0_4_ = -1;
      }
      else {
        len._0_4_ = (*h->h_first)(h->h_ref,(HistEvent_conflict *)&retval);
        fp_local = (FILE_conflict *)nelem;
        while( true ) {
          pFVar1 = fp_local;
          if ((int)len != -1) {
            fp_local = (FILE_conflict *)(fp_local[-1]._unused2 + 0x13);
          }
          if ((int)len == -1 || pFVar1 == (FILE_conflict *)0x0) break;
          len._0_4_ = (*h->h_next)(h->h_ref,(HistEvent_conflict *)&retval);
        }
      }
      if ((int)len == -1) {
        len._0_4_ = (*h->h_last)(h->h_ref,(HistEvent_conflict *)&retval);
      }
      len._4_4_ = 0;
      while (mbsrc = ev._0_8_, (int)len != -1) {
        sVar4 = strlen((char *)ev._0_8_);
        pcVar5 = str;
        if (ptr < (char *)(sVar4 * 4 + 1)) {
          ptr = (char *)(sVar4 * 4 + 0x401 & 0xfffffffffffffc00);
          pcVar5 = (char *)realloc(str,(size_t)ptr);
          if (pcVar5 == (char *)0x0) {
            len._4_4_ = -1;
            break;
          }
        }
        str = pcVar5;
        strvis(str,(char *)mbsrc,L'\x1c');
        fprintf((FILE *)ev.str,"%s\n",str);
        len._0_4_ = (*h->h_prev)(h->h_ref,(HistEvent_conflict *)&retval);
        len._4_4_ = len._4_4_ + 1;
      }
      free(str);
    }
  }
  return len._4_4_;
}

Assistant:

static int
history_save_fp(TYPE(History) *h, size_t nelem, FILE *fp)
{
	TYPE(HistEvent) ev;
	int i = -1, retval;
	size_t len, max_size;
	char *ptr;
	const char *str;
#ifndef NARROWCHAR
	static ct_buffer_t conv;
#endif

	if (ftell(fp) == 0 && fputs(hist_cookie, fp) == EOF)
		goto done;
	ptr = h_malloc((max_size = 1024) * sizeof(*ptr));
	if (ptr == NULL)
		goto done;
	if (nelem != (size_t)-1) {
		for (retval = HFIRST(h, &ev); retval != -1 && nelem-- > 0;
		    retval = HNEXT(h, &ev))
			continue;
	} else
		retval = -1;

	if (retval == -1)
		retval = HLAST(h, &ev);

	for (i = 0; retval != -1; retval = HPREV(h, &ev), i++) {
		str = ct_encode_string(ev.str, &conv);
		len = strlen(str) * 4 + 1;
		if (len > max_size) {
			char *nptr;
			max_size = (len + 1024) & (size_t)~1023;
			nptr = h_realloc(ptr, max_size * sizeof(*ptr));
			if (nptr == NULL) {
				i = -1;
				goto oomem;
			}
			ptr = nptr;
		}
		(void) strvis(ptr, str, VIS_WHITE);
		(void) fprintf(fp, "%s\n", ptr);
	}
oomem:
	h_free(ptr);
done:
	return i;
}